

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

int av1_encode(AV1_COMP *cpi,uint8_t *dest,size_t dest_size,EncodeFrameInput *frame_input,
              EncodeFrameParams *frame_params,size_t *frame_size)

{
  double *pdVar1;
  uint8_t uVar2;
  aom_enc_pass aVar3;
  aom_tune_metric aVar4;
  aom_superres_mode aVar5;
  AV1_PRIMARY *pAVar6;
  SequenceHeader *pSVar7;
  RefCntBuffer *pRVar8;
  uint8_t *puVar9;
  double dVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined6 uVar18;
  int8_t iVar19;
  int8_t iVar20;
  int iVar21;
  int iVar22;
  uint8_t uVar23;
  byte bVar24;
  DELTAQ_MODE DVar25;
  int this_index;
  int iVar26;
  int64_t iVar27;
  uint uVar28;
  long lVar29;
  long lVar30;
  uint8_t uVar31;
  int iVar32;
  CODING_CONTEXT *pCVar33;
  MV_STATS *pMVar34;
  MV_STATS *pMVar35;
  uint uVar36;
  ulong uVar37;
  int *piVar38;
  SequenceHeader *pSVar39;
  byte bVar40;
  YV12_BUFFER_CONFIG *pYVar41;
  uint *puVar42;
  int denom;
  bool bVar43;
  bool bVar44;
  _Bool _Var45;
  byte bVar46;
  double dVar47;
  int largest_tile_id;
  int largest_tile_id2;
  int64_t rate2;
  int64_t sse2;
  CODING_CONTEXT *cc;
  int largest_tile_id1;
  int64_t rate1;
  int64_t sse1;
  int superres_largest_tile_ids [8];
  int largest_tile_id_1;
  PSNR_STATS psnr;
  int local_1f4;
  AV1_COMMON *local_1f0;
  int local_1e4;
  uint *local_1e0;
  RATE_CONTROL *local_1d8;
  RATE_CONTROL *local_1d0;
  int64_t local_1c8;
  int64_t local_1c0;
  CODING_CONTEXT *local_1b8;
  uint8_t *local_1b0;
  int local_1a4;
  ulong local_1a0;
  ulong local_198;
  RefCntBuffer **local_190;
  int64_t local_188;
  int64_t local_180;
  SequenceHeader *local_178;
  RefreshFrameInfo *local_170;
  MV_STATS *local_168;
  undefined8 local_160;
  RATE_CONTROL *local_158;
  loopfilter *local_150;
  int64_t local_148;
  int64_t local_140 [5];
  int64_t local_118 [8];
  PSNR_STATS local_d8;
  
  bVar46 = 0;
  pYVar41 = frame_input->source;
  cpi->unscaled_source = pYVar41;
  cpi->source = pYVar41;
  cpi->unscaled_last_source = frame_input->last_source;
  (cpi->common).current_frame.refresh_frame_flags = frame_params->refresh_frame_flags;
  iVar26 = frame_params->error_resilient_mode;
  (cpi->common).features.error_resilient_mode = iVar26 != 0;
  (cpi->common).features.primary_ref_frame = frame_params->primary_ref_frame;
  bVar40 = frame_params->frame_type;
  (cpi->common).current_frame.frame_type = bVar40;
  (cpi->common).show_frame = frame_params->show_frame;
  cpi->ref_frame_flags = frame_params->ref_frame_flags;
  cpi->speed = frame_params->speed;
  (cpi->common).show_existing_frame = frame_params->show_existing_frame;
  cpi->existing_fb_idx_to_show = frame_params->existing_fb_idx_to_show;
  uVar11 = *(undefined8 *)(frame_params->remapped_ref_idx + 2);
  uVar12 = *(undefined8 *)(frame_params->remapped_ref_idx + 4);
  uVar13 = *(undefined8 *)(frame_params->remapped_ref_idx + 6);
  *(undefined8 *)(cpi->common).remapped_ref_idx = *(undefined8 *)frame_params->remapped_ref_idx;
  *(undefined8 *)((cpi->common).remapped_ref_idx + 2) = uVar11;
  *(undefined8 *)((cpi->common).remapped_ref_idx + 4) = uVar12;
  *(undefined8 *)((cpi->common).remapped_ref_idx + 6) = uVar13;
  _Var45 = (frame_params->refresh_frame).bwd_ref_frame;
  (cpi->refresh_frame).golden_frame = (frame_params->refresh_frame).golden_frame;
  (cpi->refresh_frame).bwd_ref_frame = _Var45;
  (cpi->refresh_frame).alt_ref_frame = (frame_params->refresh_frame).alt_ref_frame;
  pAVar6 = cpi->ppi;
  if (bVar40 == 0) {
    uVar37 = (ulong)cpi->gf_frame_index;
    if ((pAVar6->gf_group).refbuf_state[uVar37] == '\0') {
      (cpi->common).current_frame.frame_number = 0;
    }
  }
  else {
    uVar37 = (ulong)cpi->gf_frame_index;
  }
  uVar36 = frame_params->order_offset + (cpi->common).current_frame.frame_number;
  (cpi->common).current_frame.display_order_hint = uVar36;
  pSVar39 = (cpi->common).seq_params;
  (cpi->common).current_frame.order_hint =
       ~(-1 << ((char)(pSVar39->order_hint_info).order_hint_bits_minus_1 + 1U & 0x1f)) & uVar36;
  uVar28 = 1;
  if (uVar36 != 0) {
    uVar36 = (pAVar6->gf_group).layer_depth[uVar37];
    if (uVar36 == 6) {
      uVar28 = (pAVar6->gf_group).max_layer_depth;
    }
    else if ((uVar36 != 7) && (uVar28 = 1, 1 < (int)uVar36)) {
      uVar28 = uVar36;
    }
  }
  (cpi->common).current_frame.pyramid_level = uVar28;
  aVar3 = (cpi->oxcf).pass;
  if ((aVar3 == AOM_RC_FIRST_PASS) || (cpi->compressor_stage == '\x01')) {
    if ((cpi->oxcf).q_cfg.use_fixed_qp_offsets != 0) {
      av1_noop_first_pass_frame(cpi,frame_input->ts_duration);
      return 0;
    }
    av1_first_pass(cpi,frame_input->ts_duration);
    return 0;
  }
  (cpi->td).mb.e_mbd.cur_buf = pYVar41;
  if (((((aVar3 == AOM_RC_ONE_PASS) && (pAVar6->lap_enabled == 0)) && ((cpi->oxcf).mode == '\x01'))
      && ((cpi->oxcf).gf_cfg.lag_in_frames == 0)) ||
     (((cpi->oxcf).q_cfg.deltaq_mode != '\x02' ||
      (pdVar1 = &((pAVar6->twopass).stats_buf_ctx)->total_stats->frame_avg_wavelet_energy,
      0.0 < *pdVar1 || *pdVar1 == 0.0)))) {
    ((cpi->common).cur_frame)->frame_type = bVar40;
    bVar24 = (cpi->oxcf).tile_cfg.enable_large_scale_tile;
    (cpi->common).tiles.large_scale = (uint)bVar24;
    (cpi->common).tiles.single_tile_decoding =
         (uint)(cpi->oxcf).tile_cfg.enable_single_tile_decoding;
    if (iVar26 != 0) goto LAB_001c0087;
LAB_001c0196:
    pSVar7 = (cpi->common).seq_params;
    if (((pSVar7->order_hint_info).enable_ref_frame_mvs == 0) ||
       ((pSVar7->order_hint_info).enable_order_hint == 0)) {
      bVar44 = false;
      bVar43 = false;
    }
    else {
      bVar43 = (bVar40 & 0xfd) != 0;
      bVar44 = false;
    }
  }
  else {
    piVar38 = &cpi->initial_mbs;
    if ((cpi->oxcf).resize_cfg.resize_mode == '\0') {
      piVar38 = &(cpi->common).mi_params.MBs;
    }
    pYVar41 = cpi->unfiltered_source;
    lVar29 = (ulong)(cpi->is_screen_content_type == 0) * 3;
    bVar40 = block_size_wide[lVar29 + 3];
    bVar24 = block_size_high[lVar29 + 3];
    local_1f0 = (AV1_COMMON *)(double)*piVar38;
    iVar27 = av1_haar_ac_sad_mxn_uint8_input
                       ((pYVar41->field_5).field_0.y_buffer,(pYVar41->field_4).field_0.y_stride,
                        pYVar41->flags & 8,
                        (uint)(bVar24 >> 3) *
                        ((int)((uint)bVar24 + (pYVar41->field_3).field_0.y_crop_height + -1) /
                        (int)(uint)bVar24),
                        (uint)(bVar40 >> 3) *
                        ((int)((uint)bVar40 + (pYVar41->field_2).field_0.y_crop_width + -1) /
                        (int)(uint)bVar40));
    dVar47 = log1p((double)iVar27 / (double)local_1f0);
    (cpi->twopass_frame).frame_avg_haar_energy = dVar47;
    bVar40 = (cpi->common).current_frame.frame_type;
    _Var45 = (cpi->common).features.error_resilient_mode;
    ((cpi->common).cur_frame)->frame_type = bVar40;
    bVar24 = (cpi->oxcf).tile_cfg.enable_large_scale_tile;
    (cpi->common).tiles.large_scale = (uint)bVar24;
    (cpi->common).tiles.single_tile_decoding =
         (uint)(cpi->oxcf).tile_cfg.enable_single_tile_decoding;
    if ((_Var45 & 1U) == 0) goto LAB_001c0196;
LAB_001c0087:
    bVar43 = false;
    bVar44 = true;
  }
  local_190 = &(cpi->common).cur_frame;
  puVar42 = &(cpi->common).tiles.large_scale;
  (cpi->common).features.allow_ref_frame_mvs =
       ((cpi->common).features.allow_ref_frame_mvs & bVar43) != 0 && bVar24 == 0;
  if (((bVar44) || ((cpi->oxcf).motion_mode_cfg.allow_warped_motion == false)) ||
     ((bVar40 & 0xfd) == 0)) {
    (cpi->common).features.allow_warped_motion = false;
    cpi->last_frame_type = bVar40;
    if ((bVar40 & 0xfd) != 0) goto LAB_001c0217;
    cpi->frames_since_last_update = 0;
  }
  else {
    (cpi->common).features.allow_warped_motion =
         ((cpi->common).seq_params)->enable_warped_motion != '\0';
    cpi->last_frame_type = bVar40;
LAB_001c0217:
    if (bVar40 == 3) {
      (cpi->ppi->gf_group).update_type[(cpi->ppi->gf_group).size] = '\x02';
    }
  }
  local_1f0 = &cpi->common;
  if (((cpi->common).show_existing_frame != 0) &&
     (((cpi->common).features.error_resilient_mode != true ||
      ((local_1f0->current_frame).frame_type == '\0')))) {
    av1_finalize_encoded_frame(cpi);
    local_118[0]._0_4_ = 0;
    (cpi->rc).coefficient_size = 0;
    iVar26 = av1_pack_bitstream(cpi,dest,dest_size,frame_size,(int *)local_118);
    bVar44 = true;
    if (iVar26 == 0) {
      if ((pSVar39->frame_id_numbers_present_flag != '\0') &&
         ((local_1f0->current_frame).frame_type == '\0')) {
        iVar26 = (cpi->common).ref_frame_id[cpi->existing_fb_idx_to_show];
        (cpi->common).ref_frame_id[0] = iVar26;
        (cpi->common).ref_frame_id[1] = iVar26;
        (cpi->common).ref_frame_id[2] = iVar26;
        (cpi->common).ref_frame_id[3] = iVar26;
        (cpi->common).ref_frame_id[4] = iVar26;
        (cpi->common).ref_frame_id[5] = iVar26;
        (cpi->common).ref_frame_id[6] = iVar26;
        (cpi->common).ref_frame_id[7] = iVar26;
      }
      if ((cpi->common).show_frame != 0) {
        cpi->last_show_frame_buf = (cpi->common).cur_frame;
      }
      av1_set_target_rate(cpi,(cpi->common).width,(cpi->common).height);
      if (((cpi->ppi->b_calculate_psnr != 0) && ((cpi->oxcf).pass != AOM_RC_FIRST_PASS)) &&
         ((cpi->compressor_stage != '\x01' &&
          (((cpi->common).show_frame != 0 && (cpi->is_dropped_frame == false)))))) {
        pRVar8 = (cpi->common).cur_frame;
        iVar26 = (pRVar8->buf).field_2.field_0.y_crop_width;
        iVar32 = (pRVar8->buf).field_3.field_0.y_crop_height;
        pSVar39 = (cpi->common).seq_params;
        uVar31 = pSVar39->monochrome;
        pYVar41 = cpi->unscaled_source;
        if (((pYVar41->field_2).field_0.y_crop_width != iVar26) ||
           ((pYVar41->field_3).field_0.y_crop_height != iVar32)) {
          pYVar41 = &cpi->scaled_source;
          iVar26 = aom_realloc_frame_buffer
                             (pYVar41,iVar26,iVar32,pSVar39->subsampling_x,pSVar39->subsampling_y,
                              (uint)pSVar39->use_highbitdepth,0x120,
                              (cpi->common).features.byte_alignment,(aom_codec_frame_buffer_t *)0x0,
                              (aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,cpi->alloc_pyramid,0);
          if (iVar26 != 0) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to reallocate scaled source buffer");
          }
          _Var45 = av1_resize_and_extend_frame_nonnormative
                             (cpi->unscaled_source,pYVar41,((cpi->common).seq_params)->bit_depth,
                              (uint)(uVar31 == '\0') * 2 + 1);
          if (!_Var45) {
            aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                               "Failed to reallocate buffers during resize");
          }
        }
        cpi->source = pYVar41;
      }
      if (cpi->use_ducky_encode != 0) {
        aom_calc_psnr(cpi->source,&((cpi->common).cur_frame)->buf,&local_d8);
        (cpi->ducky_encode_info).frame_result.global_order_idx =
             ((cpi->common).cur_frame)->display_order_hint;
        (cpi->ducky_encode_info).frame_result.q_index = (cpi->common).quant_params.base_qindex;
        (cpi->ducky_encode_info).frame_result.rdmult = (cpi->rd).RDMULT;
        (cpi->ducky_encode_info).frame_result.rate = (int)*frame_size << 3;
        (cpi->ducky_encode_info).frame_result.dist = local_d8.sse[0];
        (cpi->ducky_encode_info).frame_result.psnr = local_d8.psnr[0];
      }
      (cpi->frame_index_set).show_frame_count = (cpi->frame_index_set).show_frame_count + 1;
      puVar42 = &(cpi->common).current_frame.frame_number;
      *puVar42 = *puVar42 + 1;
      bVar44 = false;
    }
    goto LAB_001c146a;
  }
  if (((cpi->oxcf).pass == AOM_RC_FIRST_PASS) ||
     (((cpi->compressor_stage == '\x01' ||
       ((cpi->common).features.allow_screen_content_tools != true)) ||
      ((((local_1f0->current_frame).frame_type & 0xfd) == 0 ||
       ((cpi->sf).rt_sf.use_nonrd_pick_mode != 0)))))) {
LAB_001c029c:
    (cpi->common).features.cur_frame_force_integer_mv = false;
    bVar43 = false;
  }
  else {
    uVar31 = ((cpi->common).seq_params)->force_integer_mv;
    if (uVar31 == '\x02') {
      if (cpi->unscaled_last_source == (YV12_BUFFER_CONFIG *)0x0) goto LAB_001c029c;
      iVar26 = av1_is_integer_mv(cpi->source,cpi->unscaled_last_source,&cpi->force_intpel_info);
      bVar44 = iVar26 == 0;
    }
    else {
      bVar44 = uVar31 == '\0';
    }
    bVar43 = !bVar44;
    (cpi->common).features.cur_frame_force_integer_mv = !bVar44;
  }
  (cpi->td).mb.e_mbd.cur_frame_force_integer_mv = (uint)bVar43;
  (cpi->common).lf.mode_ref_delta_update = '\0';
  bVar40 = (cpi->common).current_frame.frame_type;
  if (((bVar40 < 4) && (bVar40 != 1)) &&
     (av1_reset_segment_features(local_1f0), (cpi->common).seg.enabled != '\0')) {
    (cpi->common).seg.update_map = '\x01';
    (cpi->common).seg.update_data = '\x01';
  }
  uVar28 = 1;
  if ((cpi->oxcf).tile_cfg.mtu == 0) {
    uVar28 = (cpi->oxcf).tile_cfg.num_tile_groups;
  }
  cpi->num_tg = uVar28;
  if ((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
     ((cpi->oxcf).rc_cfg.mode == AOM_CBR)) {
    if (((0 < (cpi->svc).spatial_layer_id) && ((cpi->oxcf).rc_cfg.target_bandwidth == 0)) ||
       (iVar26 = av1_rc_drop_frame(cpi), iVar26 != 0)) {
      cpi->is_dropped_frame = true;
LAB_001c0350:
      av1_setup_frame_size(cpi);
      av1_set_mv_search_params(cpi);
      av1_rc_postencode_update_drop_frame(cpi);
      _Var45 = (cpi->refresh_frame).golden_frame;
      bVar40 = 1;
      lVar29 = 0x85a7;
      do {
        piVar38 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar29 * 8
                           );
        if (lVar29 == 0x85aa) {
          if ((((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
               ((cpi->oxcf).mode == '\x01')) &&
              (((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (cpi->ppi->use_svc == 0)))) &&
             (piVar38 != (int *)0x0)) {
            pRVar8 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
            if (piVar38[0x13c] == (pRVar8->buf).field_2.field_0.y_crop_width) {
              bVar44 = piVar38[0x13e] == (pRVar8->buf).field_3.field_0.y_crop_height;
            }
            else {
              bVar44 = false;
            }
            bVar46 = 1;
            if ((_Var45 != false) || (bVar44)) {
LAB_001c03d2:
              *piVar38 = *piVar38 + -1;
              *(undefined8 *)
               ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar29 * 8) = 0;
              bVar40 = bVar46;
            }
            else {
              bVar40 = 0;
            }
          }
          else {
            bVar46 = 1;
            if (!(bool)(~bVar40 & 1 | piVar38 == (int *)0x0)) goto LAB_001c03d2;
            bVar40 = piVar38 == (int *)0x0 & bVar40;
          }
        }
        else {
          bVar46 = bVar40;
          if (piVar38 != (int *)0x0) goto LAB_001c03d2;
        }
        lVar29 = lVar29 + 1;
        if (lVar29 == 0x85ae) {
          (cpi->ppi->gf_group).is_frame_dropped[cpi->gf_frame_index] = true;
          if ((cpi->common).show_frame == 0) {
            return 0;
          }
          (cpi->frame_index_set).show_frame_count = (cpi->frame_index_set).show_frame_count + 1;
          puVar42 = &(cpi->common).current_frame.frame_number;
          *puVar42 = *puVar42 + 1;
          return 0;
        }
      } while( true );
    }
    if ((cpi->is_dropped_frame & 1U) != 0) goto LAB_001c0350;
  }
  aVar4 = (cpi->oxcf).tune_cfg.tuning;
  if ((aVar4 < (AOM_TUNE_BUTTERAUGLI|AOM_TUNE_VMAF_WITH_PREPROCESSING)) &&
     ((0xc02U >> (aVar4 & 0x1f) & 1) != 0)) {
    av1_set_mb_ssim_rdmult_scaling(cpi);
  }
  DVar25 = (cpi->oxcf).q_cfg.deltaq_mode;
  if (DVar25 == '\x03') {
    if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
      av1_init_mb_wiener_var_buffer(cpi);
      av1_set_mb_wiener_variance(cpi);
      DVar25 = (cpi->oxcf).q_cfg.deltaq_mode;
      goto LAB_001c075c;
    }
  }
  else {
LAB_001c075c:
    if (DVar25 == '\x04') {
      av1_init_mb_ur_var_buffer(cpi);
      av1_set_mb_ur_variance(cpi);
    }
  }
  if (pSVar39->frame_id_numbers_present_flag != '\0') {
    iVar26 = (cpi->common).current_frame_id;
    if (iVar26 == -1) {
      puVar9 = (cpi->source->field_5).buffers[0];
      if ((cpi->source->flags & 8) == 0) {
        uVar31 = *puVar9;
        uVar2 = puVar9[1];
      }
      else {
        uVar31 = *(uint8_t *)((long)puVar9 * 2);
        uVar2 = *(uint8_t *)((long)puVar9 * 2 + 2);
      }
      iVar32 = 0x37;
      if ((cpi->oxcf).kf_cfg.sframe_dist == 0) {
        iVar32 = (int)((long)(ulong)CONCAT11(uVar2,uVar31) %
                      (long)(1 << ((byte)pSVar39->frame_id_length & 0x1f)));
      }
    }
    else {
      iVar32 = 1 << ((byte)pSVar39->frame_id_length & 0x1f);
      iVar32 = (iVar26 + iVar32 + 1) % iVar32;
    }
    (cpi->common).current_frame_id = iVar32;
  }
  uVar31 = (cpi->oxcf).algo_cfg.cdf_update_mode;
  _Var45 = true;
  if (uVar31 == '\0') {
LAB_001c08bd:
    (cpi->common).features.disable_cdf_update = _Var45;
  }
  else {
    if (uVar31 == '\x02') {
      if (((cpi->oxcf).mode & 0xfd) == 0) {
        if (((local_1f0->current_frame).frame_type & 0xfd) == 0) {
LAB_001c08bb:
          _Var45 = false;
        }
        else {
          _Var45 = (cpi->common).show_frame != 0;
        }
      }
      else {
LAB_001c085b:
        iVar26 = (cpi->svc).number_temporal_layers;
        if (iVar26 == 1 && (cpi->svc).number_spatial_layers == 1) {
          if ((((((local_1f0->current_frame).frame_type & 0xfd) == 0) ||
               ((((iVar26 = (cpi->resize_pending_params).width, iVar26 != 0 &&
                  (iVar32 = (cpi->resize_pending_params).height, iVar32 != 0)) &&
                 (((cpi->common).width != iVar26 || ((cpi->common).height != iVar32)))) ||
                (((cpi->rc).high_source_sad != 0 || ((cpi->rc).frames_since_key < 0x1e)))))) ||
              (((cpi->oxcf).q_cfg.aq_mode == '\x03' &&
               (cpi->cyclic_refresh->counter_encode_maxq_scene_change < 0x1e)))) ||
             ((8 < cpi->frames_since_last_update && ((cpi->rc).frame_source_sad != 0))))
          goto LAB_001c08bb;
        }
        else if (1 < iVar26) {
          _Var45 = (cpi->svc).temporal_layer_id == iVar26 + -1;
        }
      }
      goto LAB_001c08bd;
    }
    if (uVar31 == '\x01') {
      if ((((cpi->sf).rt_sf.disable_cdf_update_non_reference_frame != true) ||
          ((cpi->ppi->rtc_ref).non_reference_frame == 0)) || ((cpi->rc).frames_since_key < 3)) {
        if ((cpi->sf).rt_sf.selective_cdf_update == 0) goto LAB_001c08bb;
        goto LAB_001c085b;
      }
      goto LAB_001c08bd;
    }
  }
  if ((cpi->do_frame_data_update == false) &&
     ((cpi->ppi->gf_group).update_type[cpi->gf_frame_index] == '\x06')) {
    (cpi->common).features.disable_cdf_update = true;
  }
  if (((cpi->oxcf).tool_cfg.enable_global_motion == true) &&
     (((local_1f0->current_frame).frame_type & 0xfd) != 0)) {
    aom_invalidate_pyramid(cpi->source->y_pyramid);
    av1_invalidate_corner_list(cpi->source->corners);
  }
  local_1f4 = 0;
  iVar26 = av1_superres_in_recode_allowed(cpi);
  if (iVar26 == 0) {
    aVar5 = cpi->superres_mode;
    cpi->superres_mode = (cpi->oxcf).superres_cfg.superres_mode;
    iVar26 = encode_with_recode_loop_and_filter
                       (cpi,frame_size,dest,dest_size,(int64_t *)0x0,(int64_t *)0x0,&local_1f4);
    bVar44 = true;
    if (iVar26 != 0) goto LAB_001c146a;
    cpi->superres_mode = aVar5;
LAB_001c0c1d:
    if (pSVar39->frame_id_numbers_present_flag != '\0') {
      uVar28 = (cpi->common).current_frame.refresh_frame_flags;
      lVar29 = 0;
      do {
        if ((uVar28 >> ((uint)lVar29 & 0x1f) & 1) != 0) {
          (cpi->common).ref_frame_id[lVar29] = (cpi->common).current_frame_id;
        }
        lVar29 = lVar29 + 1;
      } while (lVar29 != 8);
    }
    if ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1) {
      piVar38 = &(cpi->svc).num_encoded_top_layer;
      *piVar38 = *piVar38 + 1;
    }
    if ((((cpi->common).seg.enabled != '\0') && ((cpi->common).seg.update_map == '\0')) &&
       (puVar9 = (cpi->common).last_frame_seg_map, puVar9 != (uint8_t *)0x0)) {
      pRVar8 = *local_190;
      memcpy(pRVar8->seg_map,puVar9,(long)pRVar8->mi_rows * (long)pRVar8->mi_cols);
    }
    if (((cpi->ppi->gf_group).frame_parallel_level[cpi->gf_frame_index] == 0) &&
       (((local_1f0->current_frame).frame_type & 0xfd) != 0)) {
      release_scaled_references(cpi);
    }
    if ((cpi->common).show_frame != 0) {
      cpi->last_show_frame_buf = (cpi->common).cur_frame;
    }
    if ((cpi->common).features.refresh_frame_context == '\x01') {
      memcpy((cpi->common).fc,&cpi->tile_data[local_1f4].tctx,0x52fc);
      av1_reset_cdf_symbol_counters((cpi->common).fc);
    }
    if (*puVar42 == 0) {
      memcpy(&((cpi->common).cur_frame)->frame_context,(cpi->common).fc,0x52fc);
    }
    if ((((cpi->oxcf).tile_cfg.enable_ext_tile_debug == true) && (*puVar42 != 0)) &&
       ((aVar3 = (cpi->oxcf).pass, AOM_RC_FIRST_PASS < aVar3 ||
        (((aVar3 == AOM_RC_ONE_PASS && (cpi->compressor_stage == '\0')) &&
         (cpi->ppi->lap_enabled != 0)))))) {
      local_d8.psnr[1] = 0.0;
      local_d8.psnr[2]._0_4_ = 0;
      uVar28 = (cpi->common).current_frame.frame_number;
      local_d8.psnr[0]._0_5_ = CONCAT14((char)(uVar28 / 100) + '0',0x63662f2e);
      uVar18 = CONCAT15((char)((uVar28 % 100) / 10),local_d8.psnr[0]._0_5_);
      local_d8.psnr[0] =
           (double)(ulong)(CONCAT16((char)uVar28 + (char)(uVar28 / 10) * -10,uVar18) |
                          0x30300000000000);
      av1_print_frame_contexts((cpi->common).fc,(char *)&local_d8);
    }
    _Var45 = (cpi->common).features.disable_cdf_update;
    cpi->last_frame_type = (cpi->common).current_frame.frame_type;
    iVar26 = 1;
    if (_Var45 == true) {
      iVar26 = cpi->frames_since_last_update + 1;
    }
    cpi->frames_since_last_update = iVar26;
    iVar26 = (cpi->svc).number_spatial_layers;
    if ((cpi->svc).spatial_layer_id == iVar26 + -1) {
      (cpi->svc).prev_number_spatial_layers = iVar26;
    }
    (cpi->svc).prev_number_temporal_layers = (cpi->svc).number_temporal_layers;
    (cpi->common).seg.update_map = '\0';
    (cpi->common).seg.update_data = '\0';
    (cpi->common).lf.mode_ref_delta_update = '\0';
    bVar44 = false;
    if ((cpi->common).show_frame != 0) {
      (cpi->frame_index_set).show_frame_count = (cpi->frame_index_set).show_frame_count + 1;
      puVar42 = &(cpi->common).current_frame.frame_number;
      *puVar42 = *puVar42 + 1;
      bVar44 = false;
    }
  }
  else {
    av1_save_all_coding_context(cpi);
    local_180 = 0x7fffffffffffffff;
    local_188 = 0x7fffffffffffffff;
    local_1a4 = 0;
    local_1c0 = 0x7fffffffffffffff;
    local_1c8 = 0x7fffffffffffffff;
    bVar40 = (cpi->ppi->gf_group).update_type[cpi->gf_frame_index];
    local_1a0 = (ulong)bVar40;
    local_198 = (ulong)((cpi->common).seq_params)->bit_depth;
    local_1e0 = puVar42;
    if ((cpi->sf).hl_sf.superres_auto_search_type == '\0') {
      local_1b0 = dest;
      local_178 = pSVar39;
      if ((byte)(bVar40 - 6) < 0xfe) {
        local_170 = &cpi->refresh_frame;
        local_1b8 = &cpi->coding_context;
        local_150 = &(cpi->common).lf;
        local_158 = &cpi->rc;
        local_160 = &(cpi->coding_context).rc;
        local_168 = &(cpi->coding_context).mv_stats;
        lVar29 = 9;
        local_1d8 = (RATE_CONTROL *)dest_size;
        local_1d0 = (RATE_CONTROL *)frame_size;
        do {
          (cpi->oxcf).superres_cfg.superres_scale_denominator = (uint8_t)lVar29;
          (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = (uint8_t)lVar29;
          cpi->superres_mode = AOM_SUPERRES_AUTO;
          iVar26 = encode_with_recode_loop_and_filter
                             (cpi,(size_t *)local_1d0,local_1b0,(size_t)local_1d8,
                              local_140 + lVar29 + 4,&local_160 + lVar29,
                              (int *)((long)&local_160 + lVar29 * 4 + 4));
          cpi->superres_mode = AOM_SUPERRES_NONE;
          if (iVar26 != 0) goto LAB_001c1465;
          uVar11 = *(undefined8 *)(local_1b8->lf).filter_level;
          uVar12 = *(undefined8 *)&(local_1b8->lf).filter_level_u;
          uVar13 = *(undefined8 *)(local_1b8->lf).backup_filter_level;
          iVar26 = (local_1b8->lf).backup_filter_level_u;
          iVar32 = (local_1b8->lf).backup_filter_level_v;
          uVar31 = (local_1b8->lf).mode_ref_delta_enabled;
          uVar2 = (local_1b8->lf).mode_ref_delta_update;
          iVar19 = (local_1b8->lf).ref_deltas[0];
          iVar20 = (local_1b8->lf).ref_deltas[1];
          uVar14 = *(undefined8 *)((local_1b8->lf).ref_deltas + 2);
          local_150->sharpness_level = (local_1b8->lf).sharpness_level;
          local_150->mode_ref_delta_enabled = uVar31;
          local_150->mode_ref_delta_update = uVar2;
          local_150->ref_deltas[0] = iVar19;
          local_150->ref_deltas[1] = iVar20;
          *(undefined8 *)(local_150->ref_deltas + 2) = uVar14;
          *(undefined8 *)local_150->backup_filter_level = uVar13;
          local_150->backup_filter_level_u = iVar26;
          local_150->backup_filter_level_v = iVar32;
          *(undefined8 *)local_150->filter_level = uVar11;
          *(undefined8 *)&local_150->filter_level_u = uVar12;
          (cpi->common).cdef_info.cdef_bits = (cpi->coding_context).cdef_info.cdef_bits;
          uVar11 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_strengths;
          uVar12 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 2);
          uVar13 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 4);
          uVar14 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 6);
          uVar15 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 8);
          uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 10);
          uVar17 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xe);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xc) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xc);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xe) = uVar17;
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 8) = uVar15;
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 10) = uVar16;
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 4) = uVar13;
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 6) = uVar14;
          *(undefined8 *)(cpi->common).cdef_info.cdef_strengths = uVar11;
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 2) = uVar12;
          uVar11 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_uv_strengths;
          uVar12 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 2);
          uVar13 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 4);
          uVar14 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 6);
          uVar15 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 8);
          uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 10);
          uVar17 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xe);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xc) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xc);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xe) = uVar17;
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 8) = uVar15;
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 10) = uVar16;
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 4) = uVar13;
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 6) = uVar14;
          *(undefined8 *)(cpi->common).cdef_info.cdef_uv_strengths = uVar11;
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 2) = uVar12;
          iVar26 = (cpi->coding_context).cdef_info.nb_cdef_strengths;
          (cpi->common).cdef_info.cdef_damping = (cpi->coding_context).cdef_info.cdef_damping;
          (cpi->common).cdef_info.nb_cdef_strengths = iVar26;
          memcpy(local_158,local_160,0x140);
          pAVar6 = cpi->ppi;
          pMVar34 = local_168;
          pMVar35 = &pAVar6->mv_stats;
          for (lVar30 = 9; lVar30 != 0; lVar30 = lVar30 + -1) {
            iVar26 = pMVar34->q;
            pMVar35->high_prec = pMVar34->high_prec;
            pMVar35->q = iVar26;
            pMVar34 = (MV_STATS *)((long)pMVar34 + (ulong)bVar46 * -0x10 + 8);
            pMVar35 = (MV_STATS *)((long)pMVar35 + ((ulong)bVar46 * -2 + 1) * 8);
          }
          (pAVar6->mv_stats).valid = local_168->valid;
          if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
            _Var45 = local_170->golden_frame;
            bVar40 = 1;
            lVar30 = 0x85a7;
            do {
              piVar38 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                                 lVar30 * 8);
              if (lVar30 == 0x85aa) {
                if (((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
                    ((cpi->oxcf).mode == '\x01')) &&
                   ((((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (cpi->ppi->use_svc == 0)) &&
                    (piVar38 != (int *)0x0)))) {
                  pRVar8 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
                  if (piVar38[0x13c] == (pRVar8->buf).field_2.field_0.y_crop_width) {
                    bVar44 = piVar38[0x13e] == (pRVar8->buf).field_3.field_0.y_crop_height;
                  }
                  else {
                    bVar44 = false;
                  }
                  bVar24 = 1;
                  if ((_Var45 != false) || (bVar44)) {
LAB_001c10ca:
                    *piVar38 = *piVar38 + -1;
                    *(undefined8 *)
                     ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar30 * 8) = 0;
                    bVar40 = bVar24;
                  }
                  else {
                    bVar40 = 0;
                  }
                }
                else {
                  bVar24 = 1;
                  if (!(bool)(~bVar40 & 1 | piVar38 == (int *)0x0)) goto LAB_001c10ca;
                  bVar40 = piVar38 == (int *)0x0 & bVar40;
                }
              }
              else {
                bVar24 = bVar40;
                if (piVar38 != (int *)0x0) goto LAB_001c10ca;
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != 0x85ae);
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 != 0x11);
        (cpi->oxcf).superres_cfg.superres_scale_denominator = '\b';
        (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = '\b';
        dest_size = (size_t)local_1d8;
        frame_size = (size_t *)local_1d0;
      }
      else {
        local_140[3] = 0;
        local_140[4] = 0;
        local_140[1] = 0;
        local_140[2] = 0;
        lVar29 = 0;
        do {
          local_d8.psnr[lVar29] = NAN;
          local_d8.psnr[lVar29 + 1] = NAN;
          local_118[lVar29] = 0x7fffffffffffffff;
          local_118[lVar29 + 1] = 0x7fffffffffffffff;
          lVar29 = lVar29 + 2;
        } while (lVar29 != 8);
      }
      iVar26 = encode_with_recode_loop_and_filter
                         (cpi,frame_size,local_1b0,dest_size,&local_1c0,&local_1c8,&local_1e4);
      uVar37 = local_198;
      if (iVar26 == 0) {
        iVar26 = av1_compute_rd_mult_based_on_qindex
                           ((aom_bit_depth_t)local_198,(FRAME_UPDATE_TYPE)local_1a0,
                            (cpi->common).quant_params.base_qindex,(cpi->oxcf).tune_cfg.tuning);
        pSVar39 = local_178;
        bVar40 = (char)uVar37 * '\x02' - 0x10;
        uVar31 = 0xff;
        lVar29 = 0;
        dVar47 = 1.79769313486232e+308;
        do {
          dVar10 = (double)((long)local_d8.psnr[lVar29] >> (bVar40 & 0x3f)) * 128.0 +
                   (double)local_118[lVar29] * (double)iVar26 * 0.001953125;
          uVar2 = (char)lVar29 + '\t';
          if (dVar47 <= dVar10) {
            dVar10 = dVar47;
            uVar2 = uVar31;
          }
          uVar31 = uVar2;
          lVar29 = lVar29 + 1;
          dVar47 = dVar10;
        } while (lVar29 != 8);
        if ((double)(local_1c0 >> (bVar40 & 0x3f)) * 128.0 +
            (double)iVar26 * (double)local_1c8 * 0.001953125 <= dVar10) {
          local_1f4 = local_1e4;
          iVar26 = 0;
          puVar42 = local_1e0;
        }
        else {
          uVar11 = *(undefined8 *)(cpi->coding_context).lf.filter_level;
          iVar21 = (cpi->coding_context).lf.filter_level_u;
          iVar22 = (cpi->coding_context).lf.filter_level_v;
          uVar12 = *(undefined8 *)(cpi->coding_context).lf.backup_filter_level;
          iVar26 = (cpi->coding_context).lf.backup_filter_level_u;
          iVar32 = (cpi->coding_context).lf.backup_filter_level_v;
          uVar2 = (cpi->coding_context).lf.mode_ref_delta_enabled;
          uVar23 = (cpi->coding_context).lf.mode_ref_delta_update;
          iVar19 = (cpi->coding_context).lf.ref_deltas[0];
          iVar20 = (cpi->coding_context).lf.ref_deltas[1];
          uVar13 = *(undefined8 *)((cpi->coding_context).lf.ref_deltas + 2);
          uVar14 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_strengths;
          uVar15 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 2);
          (cpi->common).lf.sharpness_level = (cpi->coding_context).lf.sharpness_level;
          (cpi->common).lf.mode_ref_delta_enabled = uVar2;
          (cpi->common).lf.mode_ref_delta_update = uVar23;
          (cpi->common).lf.ref_deltas[0] = iVar19;
          (cpi->common).lf.ref_deltas[1] = iVar20;
          *(undefined8 *)((cpi->common).lf.ref_deltas + 2) = uVar13;
          *(undefined8 *)(cpi->common).lf.backup_filter_level = uVar12;
          (cpi->common).lf.backup_filter_level_u = iVar26;
          (cpi->common).lf.backup_filter_level_v = iVar32;
          *(undefined8 *)(cpi->common).lf.filter_level = uVar11;
          (cpi->common).lf.filter_level_u = iVar21;
          (cpi->common).lf.filter_level_v = iVar22;
          (cpi->common).cdef_info.cdef_bits = (cpi->coding_context).cdef_info.cdef_bits;
          *(undefined8 *)(cpi->common).cdef_info.cdef_strengths = uVar14;
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 2) = uVar15;
          uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 6);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 4) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 4);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 6) = uVar11;
          uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 10);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 8) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 8);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 10) = uVar11;
          uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xe);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xc) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xc);
          *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xe) = uVar11;
          uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 2);
          *(undefined8 *)(cpi->common).cdef_info.cdef_uv_strengths =
               *(undefined8 *)(cpi->coding_context).cdef_info.cdef_uv_strengths;
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 2) = uVar11;
          uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 6);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 4) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 4);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 6) = uVar11;
          uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 10);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 8) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 8);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 10) = uVar11;
          uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xe);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xc) =
               *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xc);
          *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xe) = uVar11;
          iVar26 = (cpi->coding_context).cdef_info.nb_cdef_strengths;
          (cpi->common).cdef_info.cdef_damping = (cpi->coding_context).cdef_info.cdef_damping;
          (cpi->common).cdef_info.nb_cdef_strengths = iVar26;
          memcpy(&cpi->rc,&(cpi->coding_context).rc,0x140);
          pAVar6 = cpi->ppi;
          pMVar34 = &(cpi->coding_context).mv_stats;
          pMVar35 = &pAVar6->mv_stats;
          for (lVar29 = 9; lVar29 != 0; lVar29 = lVar29 + -1) {
            iVar26 = pMVar34->q;
            pMVar35->high_prec = pMVar34->high_prec;
            pMVar35->q = iVar26;
            pMVar34 = (MV_STATS *)((long)pMVar34 + (ulong)bVar46 * -0x10 + 8);
            pMVar35 = (MV_STATS *)((long)pMVar35 + ((ulong)bVar46 * -2 + 1) * 8);
          }
          (pAVar6->mv_stats).valid = (cpi->coding_context).mv_stats.valid;
          if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
            _Var45 = (cpi->refresh_frame).golden_frame;
            bVar40 = 1;
            lVar29 = 0x85a7;
            do {
              piVar38 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                                 lVar29 * 8);
              if (lVar29 == 0x85aa) {
                if ((((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
                     ((cpi->oxcf).mode == '\x01')) &&
                    (((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (cpi->ppi->use_svc == 0)))) &&
                   (piVar38 != (int *)0x0)) {
                  pRVar8 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
                  if (piVar38[0x13c] == (pRVar8->buf).field_2.field_0.y_crop_width) {
                    bVar44 = piVar38[0x13e] == (pRVar8->buf).field_3.field_0.y_crop_height;
                  }
                  else {
                    bVar44 = false;
                  }
                  bVar46 = 1;
                  if ((_Var45 != false) || (bVar44)) {
LAB_001c16f6:
                    *piVar38 = *piVar38 + -1;
                    *(undefined8 *)
                     ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar29 * 8) = 0;
                    bVar40 = bVar46;
                  }
                  else {
                    bVar40 = 0;
                  }
                }
                else {
                  bVar46 = 1;
                  if (!(bool)(~bVar40 & 1 | piVar38 == (int *)0x0)) goto LAB_001c16f6;
                  bVar40 = piVar38 == (int *)0x0 & bVar40;
                }
              }
              else {
                bVar46 = bVar40;
                if (piVar38 != (int *)0x0) goto LAB_001c16f6;
              }
              lVar29 = lVar29 + 1;
            } while (lVar29 != 0x85ae);
          }
          (cpi->oxcf).superres_cfg.superres_scale_denominator = uVar31;
          (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = uVar31;
          cpi->superres_mode = AOM_SUPERRES_AUTO;
          iVar26 = encode_with_recode_loop_and_filter
                             (cpi,frame_size,local_1b0,dest_size,local_140,&local_148,&local_1f4);
          cpi->superres_mode = AOM_SUPERRES_NONE;
          (cpi->oxcf).superres_cfg.superres_scale_denominator = '\b';
          (cpi->oxcf).superres_cfg.superres_kf_scale_denominator = '\b';
          puVar42 = local_1e0;
        }
LAB_001c181c:
        bVar44 = true;
        if (iVar26 != 0) goto LAB_001c146a;
        goto LAB_001c0c1d;
      }
    }
    else {
      cpi->superres_mode = AOM_SUPERRES_AUTO;
      iVar26 = encode_with_recode_loop_and_filter
                         (cpi,frame_size,dest,dest_size,&local_180,&local_188,&local_1a4);
      cpi->superres_mode = AOM_SUPERRES_NONE;
      if (iVar26 == 0) {
        uVar11 = *(undefined8 *)(cpi->coding_context).lf.filter_level;
        iVar21 = (cpi->coding_context).lf.filter_level_u;
        iVar22 = (cpi->coding_context).lf.filter_level_v;
        uVar12 = *(undefined8 *)(cpi->coding_context).lf.backup_filter_level;
        iVar26 = (cpi->coding_context).lf.backup_filter_level_u;
        iVar32 = (cpi->coding_context).lf.backup_filter_level_v;
        uVar31 = (cpi->coding_context).lf.mode_ref_delta_enabled;
        uVar2 = (cpi->coding_context).lf.mode_ref_delta_update;
        iVar19 = (cpi->coding_context).lf.ref_deltas[0];
        iVar20 = (cpi->coding_context).lf.ref_deltas[1];
        uVar13 = *(undefined8 *)((cpi->coding_context).lf.ref_deltas + 2);
        uVar14 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_strengths;
        uVar15 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 2);
        (cpi->common).lf.sharpness_level = (cpi->coding_context).lf.sharpness_level;
        (cpi->common).lf.mode_ref_delta_enabled = uVar31;
        (cpi->common).lf.mode_ref_delta_update = uVar2;
        (cpi->common).lf.ref_deltas[0] = iVar19;
        (cpi->common).lf.ref_deltas[1] = iVar20;
        *(undefined8 *)((cpi->common).lf.ref_deltas + 2) = uVar13;
        *(undefined8 *)(cpi->common).lf.backup_filter_level = uVar12;
        (cpi->common).lf.backup_filter_level_u = iVar26;
        (cpi->common).lf.backup_filter_level_v = iVar32;
        *(undefined8 *)(cpi->common).lf.filter_level = uVar11;
        (cpi->common).lf.filter_level_u = iVar21;
        (cpi->common).lf.filter_level_v = iVar22;
        (cpi->common).cdef_info.cdef_bits = (cpi->coding_context).cdef_info.cdef_bits;
        *(undefined8 *)(cpi->common).cdef_info.cdef_strengths = uVar14;
        *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 2) = uVar15;
        uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 6);
        *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 4) =
             *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 4);
        *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 6) = uVar11;
        uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 10);
        *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 8) =
             *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 8);
        *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 10) = uVar11;
        uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xe);
        *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xc) =
             *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xc);
        *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xe) = uVar11;
        uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 2);
        *(undefined8 *)(cpi->common).cdef_info.cdef_uv_strengths =
             *(undefined8 *)(cpi->coding_context).cdef_info.cdef_uv_strengths;
        *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 2) = uVar11;
        uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 6);
        *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 4) =
             *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 4);
        *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 6) = uVar11;
        uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 10);
        *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 8) =
             *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 8);
        *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 10) = uVar11;
        uVar11 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xe);
        *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xc) =
             *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xc);
        *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xe) = uVar11;
        iVar26 = (cpi->coding_context).cdef_info.nb_cdef_strengths;
        (cpi->common).cdef_info.cdef_damping = (cpi->coding_context).cdef_info.cdef_damping;
        (cpi->common).cdef_info.nb_cdef_strengths = iVar26;
        local_1d0 = &cpi->rc;
        local_1d8 = &(cpi->coding_context).rc;
        memcpy(local_1d0,local_1d8,0x140);
        pAVar6 = cpi->ppi;
        local_1b8 = (CODING_CONTEXT *)&(cpi->coding_context).mv_stats;
        pMVar34 = (MV_STATS *)local_1b8;
        pMVar35 = &pAVar6->mv_stats;
        for (lVar29 = 9; lVar29 != 0; lVar29 = lVar29 + -1) {
          iVar26 = pMVar34->q;
          pMVar35->high_prec = pMVar34->high_prec;
          pMVar35->q = iVar26;
          pMVar34 = (MV_STATS *)((long)pMVar34 + (ulong)bVar46 * -0x10 + 8);
          pMVar35 = (MV_STATS *)((long)pMVar35 + ((ulong)bVar46 * -2 + 1) * 8);
        }
        (pAVar6->mv_stats).valid = (cpi->coding_context).mv_stats.valid;
        if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
          _Var45 = (cpi->refresh_frame).golden_frame;
          bVar40 = 1;
          lVar29 = 0x85a7;
          do {
            piVar38 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                               lVar29 * 8);
            if (lVar29 == 0x85aa) {
              if (((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
                  ((cpi->oxcf).mode == '\x01')) &&
                 ((((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (cpi->ppi->use_svc == 0)) &&
                  (piVar38 != (int *)0x0)))) {
                pRVar8 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
                if (piVar38[0x13c] == (pRVar8->buf).field_2.field_0.y_crop_width) {
                  bVar44 = piVar38[0x13e] == (pRVar8->buf).field_3.field_0.y_crop_height;
                }
                else {
                  bVar44 = false;
                }
                bVar24 = 1;
                if ((_Var45 != false) || (bVar44)) {
LAB_001c0b6c:
                  *piVar38 = *piVar38 + -1;
                  *(undefined8 *)
                   ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar29 * 8) = 0;
                  bVar40 = bVar24;
                }
                else {
                  bVar40 = 0;
                }
              }
              else {
                bVar24 = 1;
                if (!(bool)(~bVar40 & 1 | piVar38 == (int *)0x0)) goto LAB_001c0b6c;
                bVar40 = piVar38 == (int *)0x0 & bVar40;
              }
            }
            else {
              bVar24 = bVar40;
              if (piVar38 != (int *)0x0) goto LAB_001c0b6c;
            }
            lVar29 = lVar29 + 1;
          } while (lVar29 != 0x85ae);
        }
        iVar26 = encode_with_recode_loop_and_filter
                           (cpi,frame_size,dest,dest_size,&local_1c0,&local_1c8,&local_1e4);
        uVar37 = local_198;
        if (iVar26 == 0) {
          iVar26 = av1_compute_rd_mult_based_on_qindex
                             ((aom_bit_depth_t)local_198,(FRAME_UPDATE_TYPE)local_1a0,
                              (cpi->common).quant_params.base_qindex,(cpi->oxcf).tune_cfg.tuning);
          bVar40 = (char)uVar37 * '\x02' - 0x10;
          if ((double)(local_180 >> (bVar40 & 0x3f)) * 128.0 +
              (double)local_188 * (double)iVar26 * 0.001953125 <
              (double)(local_1c0 >> (bVar40 & 0x3f)) * 128.0 +
              (double)local_1c8 * (double)iVar26 * 0.001953125) {
            uVar11 = *(undefined8 *)(cpi->coding_context).lf.filter_level;
            iVar21 = (cpi->coding_context).lf.filter_level_u;
            iVar22 = (cpi->coding_context).lf.filter_level_v;
            uVar12 = *(undefined8 *)(cpi->coding_context).lf.backup_filter_level;
            iVar26 = (cpi->coding_context).lf.backup_filter_level_u;
            iVar32 = (cpi->coding_context).lf.backup_filter_level_v;
            uVar31 = (cpi->coding_context).lf.mode_ref_delta_enabled;
            uVar2 = (cpi->coding_context).lf.mode_ref_delta_update;
            iVar19 = (cpi->coding_context).lf.ref_deltas[0];
            iVar20 = (cpi->coding_context).lf.ref_deltas[1];
            uVar13 = *(undefined8 *)((cpi->coding_context).lf.ref_deltas + 2);
            (cpi->common).lf.sharpness_level = (cpi->coding_context).lf.sharpness_level;
            (cpi->common).lf.mode_ref_delta_enabled = uVar31;
            (cpi->common).lf.mode_ref_delta_update = uVar2;
            (cpi->common).lf.ref_deltas[0] = iVar19;
            (cpi->common).lf.ref_deltas[1] = iVar20;
            *(undefined8 *)((cpi->common).lf.ref_deltas + 2) = uVar13;
            *(undefined8 *)(cpi->common).lf.backup_filter_level = uVar12;
            (cpi->common).lf.backup_filter_level_u = iVar26;
            (cpi->common).lf.backup_filter_level_v = iVar32;
            *(undefined8 *)(cpi->common).lf.filter_level = uVar11;
            (cpi->common).lf.filter_level_u = iVar21;
            (cpi->common).lf.filter_level_v = iVar22;
            (cpi->common).cdef_info.cdef_bits = (cpi->coding_context).cdef_info.cdef_bits;
            uVar11 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_strengths;
            uVar12 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 2);
            uVar13 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 4);
            uVar14 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 6);
            uVar15 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 8);
            uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 10);
            uVar17 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xe);
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xc) =
                 *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xc);
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xe) = uVar17;
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 8) = uVar15;
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 10) = uVar16;
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 4) = uVar13;
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 6) = uVar14;
            *(undefined8 *)(cpi->common).cdef_info.cdef_strengths = uVar11;
            *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 2) = uVar12;
            uVar11 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_uv_strengths;
            uVar12 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 2);
            uVar13 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 4);
            uVar14 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 6);
            uVar15 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 8);
            uVar16 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 10);
            uVar17 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xe);
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xc) =
                 *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xc);
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xe) = uVar17;
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 8) = uVar15;
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 10) = uVar16;
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 4) = uVar13;
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 6) = uVar14;
            *(undefined8 *)(cpi->common).cdef_info.cdef_uv_strengths = uVar11;
            *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 2) = uVar12;
            iVar26 = (cpi->coding_context).cdef_info.nb_cdef_strengths;
            (cpi->common).cdef_info.cdef_damping = (cpi->coding_context).cdef_info.cdef_damping;
            (cpi->common).cdef_info.nb_cdef_strengths = iVar26;
            memcpy(local_1d0,local_1d8,0x140);
            puVar42 = local_1e0;
            pAVar6 = cpi->ppi;
            pCVar33 = local_1b8;
            pMVar34 = &pAVar6->mv_stats;
            for (lVar29 = 9; lVar29 != 0; lVar29 = lVar29 + -1) {
              *(undefined8 *)pMVar34 = *(undefined8 *)(pCVar33->lf).filter_level;
              pCVar33 = (CODING_CONTEXT *)((long)pCVar33 + (ulong)bVar46 * -0x10 + 8);
              pMVar34 = (MV_STATS *)((long)pMVar34 + ((ulong)bVar46 * -2 + 1) * 8);
            }
            (pAVar6->mv_stats).valid = *(int *)(local_1b8->cdef_info).linebuf;
            if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
              _Var45 = (cpi->refresh_frame).golden_frame;
              bVar40 = 1;
              lVar29 = 0x85a7;
              do {
                piVar38 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) +
                                   lVar29 * 8);
                if (lVar29 == 0x85aa) {
                  if ((((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
                       ((cpi->oxcf).mode == '\x01')) &&
                      (((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (cpi->ppi->use_svc == 0)))) &&
                     (piVar38 != (int *)0x0)) {
                    pRVar8 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
                    if (piVar38[0x13c] == (pRVar8->buf).field_2.field_0.y_crop_width) {
                      bVar44 = piVar38[0x13e] == (pRVar8->buf).field_3.field_0.y_crop_height;
                    }
                    else {
                      bVar44 = false;
                    }
                    bVar46 = 1;
                    if ((_Var45 != false) || (bVar44)) {
LAB_001c138f:
                      *piVar38 = *piVar38 + -1;
                      *(undefined8 *)
                       ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar29 * 8) =
                           0;
                      bVar40 = bVar46;
                    }
                    else {
                      bVar40 = 0;
                    }
                  }
                  else {
                    bVar46 = 1;
                    if (!(bool)(~bVar40 & 1 | piVar38 == (int *)0x0)) goto LAB_001c138f;
                    bVar40 = piVar38 == (int *)0x0 & bVar40;
                  }
                }
                else {
                  bVar46 = bVar40;
                  if (piVar38 != (int *)0x0) goto LAB_001c138f;
                }
                lVar29 = lVar29 + 1;
              } while (lVar29 != 0x85ae);
            }
            cpi->superres_mode = AOM_SUPERRES_AUTO;
            iVar26 = encode_with_recode_loop_and_filter
                               (cpi,frame_size,dest,dest_size,(int64_t *)&local_d8,local_118,
                                &local_1f4);
            cpi->superres_mode = AOM_SUPERRES_NONE;
            goto LAB_001c181c;
          }
          local_1f4 = local_1e4;
          puVar42 = local_1e0;
          goto LAB_001c0c1d;
        }
      }
    }
LAB_001c1465:
    bVar44 = true;
  }
LAB_001c146a:
  if (!bVar44) {
    return 0;
  }
  return 1;
}

Assistant:

int av1_encode(AV1_COMP *const cpi, uint8_t *const dest, size_t dest_size,
               const EncodeFrameInput *const frame_input,
               const EncodeFrameParams *const frame_params,
               size_t *const frame_size) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;

  cpi->unscaled_source = frame_input->source;
  cpi->source = frame_input->source;
  cpi->unscaled_last_source = frame_input->last_source;

  current_frame->refresh_frame_flags = frame_params->refresh_frame_flags;
  cm->features.error_resilient_mode = frame_params->error_resilient_mode;
  cm->features.primary_ref_frame = frame_params->primary_ref_frame;
  cm->current_frame.frame_type = frame_params->frame_type;
  cm->show_frame = frame_params->show_frame;
  cpi->ref_frame_flags = frame_params->ref_frame_flags;
  cpi->speed = frame_params->speed;
  cm->show_existing_frame = frame_params->show_existing_frame;
  cpi->existing_fb_idx_to_show = frame_params->existing_fb_idx_to_show;

  memcpy(cm->remapped_ref_idx, frame_params->remapped_ref_idx,
         REF_FRAMES * sizeof(*cm->remapped_ref_idx));

  memcpy(&cpi->refresh_frame, &frame_params->refresh_frame,
         sizeof(cpi->refresh_frame));

  if (current_frame->frame_type == KEY_FRAME &&
      cpi->ppi->gf_group.refbuf_state[cpi->gf_frame_index] == REFBUF_RESET) {
    current_frame->frame_number = 0;
  }

  current_frame->order_hint =
      current_frame->frame_number + frame_params->order_offset;

  current_frame->display_order_hint = current_frame->order_hint;
  current_frame->order_hint %=
      (1 << (cm->seq_params->order_hint_info.order_hint_bits_minus_1 + 1));

  current_frame->pyramid_level = get_true_pyr_level(
      cpi->ppi->gf_group.layer_depth[cpi->gf_frame_index],
      current_frame->display_order_hint, cpi->ppi->gf_group.max_layer_depth);

  if (is_stat_generation_stage(cpi)) {
#if !CONFIG_REALTIME_ONLY
    if (cpi->oxcf.q_cfg.use_fixed_qp_offsets)
      av1_noop_first_pass_frame(cpi, frame_input->ts_duration);
    else
      av1_first_pass(cpi, frame_input->ts_duration);
#endif
  } else if (cpi->oxcf.pass == AOM_RC_ONE_PASS ||
             cpi->oxcf.pass >= AOM_RC_SECOND_PASS) {
    if (encode_frame_to_data_rate(cpi, frame_size, dest, dest_size) !=
        AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_ERROR;
  }

  return AOM_CODEC_OK;
}